

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result emulator_read_ext_ram_from_file(Emulator *e,char *filename)

{
  Result RVar1;
  undefined1 local_38 [8];
  FileData file_data;
  Result result;
  char *filename_local;
  Emulator *e_local;
  
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    file_data.size._4_4_ = ERROR;
    memset(local_38,0,0x10);
    RVar1 = file_read(filename,(FileData *)local_38);
    if ((RVar1 == OK) && (RVar1 = emulator_read_ext_ram(e,(FileData *)local_38), RVar1 == OK)) {
      file_data.size._4_4_ = OK;
    }
    file_data_delete((FileData *)local_38);
    e_local._4_4_ = file_data.size._4_4_;
  }
  else {
    e_local._4_4_ = OK;
  }
  return e_local._4_4_;
}

Assistant:

Result emulator_read_ext_ram_from_file(Emulator* e, const char* filename) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;
  Result result = ERROR;
  FileData file_data;
  ZERO_MEMORY(file_data);
  CHECK(SUCCESS(file_read(filename, &file_data)));
  CHECK(SUCCESS(emulator_read_ext_ram(e, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}